

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode set_login(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (((conn->handler->flags & 0x20) == 0) || ((data->state).aptr.user != (char *)0x0)) {
    pcVar2 = "";
    pcVar3 = "";
  }
  else {
    pcVar3 = "ftp@example.com";
    pcVar2 = "anonymous";
  }
  if (conn->user == (char *)0x0) {
    pcVar2 = (*Curl_cstrdup)(pcVar2);
    conn->user = pcVar2;
    if (pcVar2 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  CVar1 = CURLE_OK;
  if (conn->passwd == (char *)0x0) {
    pcVar2 = (*Curl_cstrdup)(pcVar3);
    conn->passwd = pcVar2;
    CVar1 = CURLE_OUT_OF_MEMORY;
    if (pcVar2 != (char *)0x0) {
      CVar1 = CURLE_OK;
    }
  }
  return CVar1;
}

Assistant:

static CURLcode set_login(struct Curl_easy *data,
                          struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  const char *setuser = CURL_DEFAULT_USER;
  const char *setpasswd = CURL_DEFAULT_PASSWORD;

  /* If our protocol needs a password and we have none, use the defaults */
  if((conn->handler->flags & PROTOPT_NEEDSPWD) && !data->state.aptr.user)
    ;
  else {
    setuser = "";
    setpasswd = "";
  }
  /* Store the default user */
  if(!conn->user) {
    conn->user = strdup(setuser);
    if(!conn->user)
      return CURLE_OUT_OF_MEMORY;
  }

  /* Store the default password */
  if(!conn->passwd) {
    conn->passwd = strdup(setpasswd);
    if(!conn->passwd)
      result = CURLE_OUT_OF_MEMORY;
  }

  return result;
}